

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O1

int zueci_eci_to_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,uchar *dest,
                     int *p_dest_len)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_0000000c;
  size_t sVar7;
  int iVar8;
  zueci_u32 zVar9;
  byte *pbVar10;
  uchar replacement [5];
  size_t local_68;
  zueci_u32 local_5c;
  uchar local_55 [5];
  size_t local_50;
  uchar *local_48;
  undefined8 local_40;
  zueci_utf8_func_t local_38;
  
  local_40 = CONCAT44(in_register_0000000c,replacement_char);
  if ((uint)eci < 0x24) {
    if (eci == 0xe) {
      return 7;
    }
    if (eci == 0x13) {
      return 7;
    }
  }
  else if ((eci != 899) && (eci != 0xaa)) {
    return 7;
  }
  if (p_dest_len == (int *)0x0 || (dest == (uchar *)0x0 || src == (uchar *)0x0)) {
    return 8;
  }
  sVar7 = (size_t)src_len;
  pbVar1 = src + sVar7;
  iVar5 = (int)dest;
  if ((eci == 899) ||
     (((flags & 1) != 0 &&
      ((((uint)eci < 0x1c && ((0x800000aU >> (eci & 0x1fU) & 1) != 0)) || (eci == 0xaa)))))) {
    if (0 < src_len) {
      do {
        bVar2 = *src;
        src = src + 1;
        uVar3 = zueci_encode_utf8((uint)bVar2,dest);
        dest = dest + uVar3;
      } while (src < pbVar1);
    }
    src_len = (int)dest - iVar5;
LAB_00190ea6:
    iVar8 = 0;
    goto LAB_00190ea8;
  }
  if (replacement_char == 0) {
    local_68 = 0;
  }
  else {
    if (0xd7ff < replacement_char && replacement_char - 0x10000 < 0xffffe000) {
      return 8;
    }
    local_50 = sVar7;
    uVar3 = zueci_encode_utf8(replacement_char,local_55);
    local_68 = (size_t)uVar3;
    sVar7 = local_50;
  }
  if ((eci & 0x3bdU) == 1) {
    iVar8 = 0;
    if (0 < src_len) {
      do {
        if ((char)*src < -0x60) {
          if ((int)local_40 == 0) {
            return 6;
          }
          memcpy(dest,local_55,local_68);
          iVar8 = 1;
          sVar7 = local_68;
        }
        else {
          uVar3 = zueci_encode_utf8((uint)*src,dest);
          sVar7 = (size_t)uVar3;
        }
        dest = dest + sVar7;
        src = src + 1;
      } while (src < pbVar1);
    }
    src_len = (int)dest - iVar5;
    goto LAB_00190ea8;
  }
  local_48 = dest;
  if (eci == 0xaa) {
    local_38 = zueci_ascii_inv_u;
LAB_00191049:
    if (src_len < 1) {
LAB_001910e7:
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      do {
        local_50 = CONCAT44(local_50._4_4_,iVar8);
        zVar9 = (int)pbVar1 - (int)src;
        iVar5 = (*local_38)(src,zVar9,flags,&local_5c);
        if (iVar5 == 0) {
          if ((int)local_40 == 0) {
            return 6;
          }
          memcpy(dest,local_55,local_68);
          iVar5 = zueci_replacement_incr(eci,src,zVar9);
          iVar8 = 1;
          uVar6 = local_68;
        }
        else {
          uVar3 = zueci_encode_utf8(local_5c,dest);
          uVar6 = (ulong)uVar3;
          iVar8 = (int)local_50;
        }
        dest = dest + uVar6;
        src = src + iVar5;
      } while (src < pbVar1);
    }
  }
  else {
    if (eci != 0x1a) {
      local_38 = zueci_utf8_funcs[(uint)eci];
      goto LAB_00191049;
    }
    if ((int)local_40 == 0) {
      uVar3 = 0;
      pbVar10 = src;
      while (pbVar10 < pbVar1) {
        bVar2 = *pbVar10;
        pbVar10 = pbVar10 + 1;
        uVar3 = (uint)(byte)zueci_decode_utf8_utf8d
                            [(ulong)uVar3 + (ulong)(byte)zueci_decode_utf8_utf8d[bVar2] + 0x100];
        if (uVar3 == 0xc) {
          return 9;
        }
      }
      if (uVar3 != 0) {
        return 9;
      }
      memcpy(dest,src,sVar7);
      goto LAB_00190ea6;
    }
    if (src_len < 1) goto LAB_001910e7;
    iVar8 = 0;
    uVar3 = 0;
    zVar9 = local_5c;
LAB_00190f70:
    do {
      pbVar10 = src;
      bVar2 = *pbVar10;
      if (uVar3 == 0) {
        zVar9 = 0xffU >> (zueci_decode_utf8_utf8d[bVar2] & 0x1f) & (uint)bVar2;
      }
      else {
        zVar9 = zVar9 << 6 | bVar2 & 0x3f;
      }
      bVar2 = zueci_decode_utf8_utf8d
              [(ulong)(byte)zueci_decode_utf8_utf8d[bVar2] + (ulong)uVar3 + 0x100];
      uVar3 = (uint)bVar2;
      local_5c = zVar9;
      if (pbVar10 + 1 < pbVar1) {
        if (bVar2 != 0) {
          src = pbVar10 + 1;
          if (uVar3 == 0xc) goto LAB_00190fc4;
          goto LAB_00190f70;
        }
LAB_00190fff:
        local_50 = CONCAT44(local_50._4_4_,iVar8);
        uVar4 = zueci_encode_utf8(zVar9,dest);
        sVar7 = (size_t)uVar4;
        pbVar10 = pbVar10 + 1;
        iVar8 = (int)local_50;
      }
      else {
        if (bVar2 == 0) goto LAB_00190fff;
LAB_00190fc4:
        if ((char)*pbVar10 < '\0') {
          pbVar10 = pbVar10 + 1;
        }
        memcpy(dest,local_55,local_68);
        uVar3 = 0;
        sVar7 = local_68;
        iVar8 = 1;
      }
      dest = dest + sVar7;
      src = pbVar10;
    } while (pbVar10 < pbVar1);
  }
  src_len = (int)dest - (int)local_48;
LAB_00190ea8:
  *p_dest_len = src_len;
  return iVar8;
}

Assistant:

ZUECI_EXTERN int zueci_eci_to_utf8(const int eci, const unsigned char src[], const int src_len,
                    const unsigned int replacement_char, const unsigned int flags, unsigned char dest[],
                    int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    unsigned char *d = dest;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int ret = 0;

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !dest || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            d += zueci_encode_utf8(*s++, d);
        }
        *p_dest_len = (int) (d - dest);
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                memcpy(d, replacement, replacement_len);
                d += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                d += zueci_encode_utf8(*s, d);
            }
        }
        *p_dest_len = (int) (d - dest);
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        if (replacement_char) {
            unsigned int state = 0;
            while (s < se) {
                do {
                    zueci_decode_utf8(&state, &u, *s++);
                } while (s < se && state != 0 && state != 12);
                if (state != 0) {
                    if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                        s--;
                    } else {
                        while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                            s++;
                        }
                    }
                    memcpy(d, replacement, replacement_len);
                    d += replacement_len;
                    ret = ZUECI_WARN_INVALID_DATA;
                    state = 0;
                } else {
                    d += zueci_encode_utf8(u, d);
                }
            }
            *p_dest_len = (int) (d - dest);
            return ret;
        }
        if (!zueci_is_valid_utf8(src, src_len)) {
            return ZUECI_ERROR_INVALID_UTF8;
        }
        memcpy(dest, src, src_len);
        *p_dest_len = src_len;
        return 0;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            memcpy(d, replacement, replacement_len);
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            d += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            d += zueci_encode_utf8(u, d);
        }
    }
    *p_dest_len = (int) (d - dest);
    return ret;
}